

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counter.c
# Opt level: O0

uint32_t __thiscall nsync::nsync_counter_wait(nsync *this,nsync_counter c,nsync_time abs_deadline)

{
  int iVar1;
  nsync_time abs_deadline_00;
  uint local_3c;
  nsync_waitable_s **ppnStack_38;
  uint32_t result;
  nsync_waitable_s *pwaitable;
  nsync_waitable_s waitable;
  nsync_counter c_local;
  nsync_time abs_deadline_local;
  
  ppnStack_38 = &pwaitable;
  local_3c = 0;
  waitable.v = nsync_counter_waitable_funcs;
  abs_deadline_00.tv_nsec = 1;
  abs_deadline_00.tv_sec = abs_deadline.tv_sec;
  pwaitable = (nsync_waitable_s *)this;
  waitable.funcs = (nsync_waitable_funcs_s *)this;
  iVar1 = nsync_wait_n((nsync *)0x0,(void *)0x0,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)c,
                       abs_deadline_00,(int)&stack0xffffffffffffffc8,(nsync_waitable_s **)c);
  if (iVar1 != 0) {
    local_3c = std::atomic_load_explicit<unsigned_int>
                         ((atomic<unsigned_int> *)(waitable.funcs + 1),memory_order_acquire);
  }
  return local_3c;
}

Assistant:

uint32_t nsync_counter_wait (nsync_counter c, nsync_time abs_deadline) {
	struct nsync_waitable_s waitable;
	struct nsync_waitable_s *pwaitable = &waitable;
	uint32_t result = 0;
	waitable.v = c;
	waitable.funcs = &nsync_counter_waitable_funcs;
	if (nsync_wait_n (NULL, NULL, NULL, abs_deadline, 1, &pwaitable) != 0) {
		IGNORE_RACES_START ();
		result = ATM_LOAD_ACQ (&c->value);
		IGNORE_RACES_END ();
	}
	return (result);
}